

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_options_common<wchar_t>::basic_json_options_common
          (basic_json_options_common<wchar_t> *this,basic_json_options_common<wchar_t> *param_1)

{
  this->_vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_options_common_009a12b8;
  *(undefined2 *)&this->field_0x8 = *(undefined2 *)&param_1->field_0x8;
  std::__cxx11::wstring::wstring((wstring *)&this->nan_to_num_,(wstring *)&param_1->nan_to_num_);
  std::__cxx11::wstring::wstring((wstring *)&this->inf_to_num_,(wstring *)&param_1->inf_to_num_);
  std::__cxx11::wstring::wstring
            ((wstring *)&this->neginf_to_num_,(wstring *)&param_1->neginf_to_num_);
  std::__cxx11::wstring::wstring((wstring *)&this->nan_to_str_,(wstring *)&param_1->nan_to_str_);
  std::__cxx11::wstring::wstring((wstring *)&this->inf_to_str_,(wstring *)&param_1->inf_to_str_);
  std::__cxx11::wstring::wstring
            ((wstring *)&this->neginf_to_str_,(wstring *)&param_1->neginf_to_str_);
  this->max_nesting_depth_ = param_1->max_nesting_depth_;
  return;
}

Assistant:

basic_json_options_common(const basic_json_options_common&) = default;